

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multipleofnumbers.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  double dVar1;
  char *__nptr;
  char cVar2;
  int iVar3;
  istream *piVar4;
  int *piVar5;
  long lVar6;
  long *plVar7;
  undefined8 uVar8;
  int iVar9;
  int iVar10;
  vector<int,_std::allocator<int>_> nums;
  string token;
  string line;
  istringstream ss;
  ifstream stream;
  int local_42c;
  vector<int,_std::allocator<int>_> local_428;
  double local_408;
  char *local_400;
  char *local_3f8;
  undefined8 local_3f0;
  char local_3e8 [16];
  undefined1 *local_3d8;
  undefined8 local_3d0;
  undefined1 local_3c8 [16];
  istringstream local_3b8 [120];
  ios_base local_340 [264];
  long local_238 [65];
  
  std::ifstream::ifstream((istream *)local_238,argv[1],_S_in);
  local_3d8 = local_3c8;
  local_3d0 = 0;
  local_3c8[0] = 0;
  local_3f8 = local_3e8;
  local_3f0 = 0;
  local_3e8[0] = '\0';
  local_428.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (int *)0x0;
  local_428.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (int *)0x0;
  local_428.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
       = (int *)0x0;
  do {
    cVar2 = std::ios::widen((char)*(undefined8 *)(local_238[0] + -0x18) + (char)(istream *)local_238
                           );
    piVar4 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                       ((istream *)local_238,(string *)&local_3d8,cVar2);
    if (((byte)piVar4[*(long *)(*(long *)piVar4 + -0x18) + 0x20] & 5) != 0) {
      if (local_428.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start != (int *)0x0) {
        operator_delete(local_428.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      if (local_3f8 != local_3e8) {
        operator_delete(local_3f8);
      }
      if (local_3d8 != local_3c8) {
        operator_delete(local_3d8);
      }
      std::ifstream::~ifstream(local_238);
      return 0;
    }
    std::__cxx11::istringstream::istringstream(local_3b8,(string *)&local_3d8,_S_in);
    while( true ) {
      piVar4 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                         ((istream *)local_3b8,(string *)&local_3f8,',');
      __nptr = local_3f8;
      if (((byte)piVar4[*(long *)(*(long *)piVar4 + -0x18) + 0x20] & 5) != 0) break;
      piVar5 = __errno_location();
      iVar9 = *piVar5;
      *piVar5 = 0;
      lVar6 = strtol(__nptr,&local_400,10);
      if (local_400 == __nptr) {
        std::__throw_invalid_argument("stoi");
LAB_001025ed:
        uVar8 = std::__throw_out_of_range("stoi");
        if (local_428.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start != (int *)0x0) {
          operator_delete(local_428.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
        }
        if (local_3f8 != local_3e8) {
          operator_delete(local_3f8);
        }
        if (local_3d8 != local_3c8) {
          operator_delete(local_3d8);
        }
        std::ifstream::~ifstream(local_238);
        _Unwind_Resume(uVar8);
      }
      iVar3 = (int)lVar6;
      if ((iVar3 != lVar6) || (*piVar5 == 0x22)) goto LAB_001025ed;
      if (*piVar5 == 0) {
        *piVar5 = iVar9;
      }
      local_42c = iVar3;
      if (local_428.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_finish ==
          local_428.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage) {
        std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                  (&local_428,
                   (iterator)
                   local_428.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish,&local_42c);
      }
      else {
        *local_428.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_finish = iVar3;
        local_428.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish = local_428.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_finish + 1;
      }
    }
    iVar9 = *local_428.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
             ._M_start;
    iVar3 = local_428.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start[1];
    local_408 = log2((double)iVar3);
    dVar1 = floor(local_408);
    if ((local_408 != dVar1) || (NAN(local_408) || NAN(dVar1))) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Bad input",9);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x80);
      plVar7 = &std::cout;
    }
    else {
      iVar9 = iVar9 + 1;
      iVar10 = iVar9;
      if (iVar9 < iVar3) {
        iVar10 = iVar3;
      }
      plVar7 = (long *)std::ostream::operator<<
                                 ((ostream *)&std::cout,
                                  ((uint)(iVar3 < iVar9) +
                                   ((iVar10 - iVar3) - (uint)(iVar3 < iVar9)) /
                                   (iVar3 + (uint)(iVar3 == 0)) + 1) * iVar3);
      std::ios::widen((char)*(undefined8 *)(*plVar7 + -0x18) + (char)plVar7);
    }
    std::ostream::put((char)plVar7);
    std::ostream::flush();
    if (local_428.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish !=
        local_428.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start) {
      local_428.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish = local_428.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start;
    }
    std::__cxx11::istringstream::~istringstream(local_3b8);
    std::ios_base::~ios_base(local_340);
  } while( true );
}

Assistant:

int main(int argc, char *argv[]) {
    ifstream stream(argv[1]);
//    ifstream stream("/home/arkezar/nums");
    string line;
    string token;
    vector<int> nums;
    int x, n, multN;
    while (getline(stream, line)) {
        istringstream ss(line);
        while(getline(ss,token,',')){
            nums.push_back(stoi(token));
        }

        n = nums[1];
        x = nums[0];
        if(isInt(log2(n))) {
            multN = n;
            while (multN <= x) {
                multN += n;
            }

            cout << multN << endl;
        } else {
            cout << "Bad input" << endl;
        }
        nums.clear();
    }
    return 0;
}